

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

void * OPENSSL_malloc(size_t size)

{
  void *pvVar1;
  
  pvVar1 = (void *)OPENSSL_memory_alloc(size);
  if (size != 0 && pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
    ERR_put_error(0xe,0,0x41,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem.cc"
                  ,0xd9);
  }
  return pvVar1;
}

Assistant:

void *OPENSSL_malloc(size_t size) {
  void *ptr = nullptr;
  if (should_fail_allocation()) {
    goto err;
  }

  if (OPENSSL_memory_alloc != NULL) {
    assert(OPENSSL_memory_free != NULL);
    assert(OPENSSL_memory_get_size != NULL);
    void *ptr2 = OPENSSL_memory_alloc(size);
    if (ptr2 == NULL && size != 0) {
      goto err;
    }
    return ptr2;
  }

  if (size + OPENSSL_MALLOC_PREFIX < size) {
    goto err;
  }

  ptr = malloc(size + OPENSSL_MALLOC_PREFIX);
  if (ptr == NULL) {
    goto err;
  }

  *(size_t *)ptr = size;

  __asan_poison_memory_region(ptr, OPENSSL_MALLOC_PREFIX);
  return ((uint8_t *)ptr) + OPENSSL_MALLOC_PREFIX;

err:
  // This only works because ERR does not call OPENSSL_malloc.
  OPENSSL_PUT_ERROR(CRYPTO, ERR_R_MALLOC_FAILURE);
  return NULL;
}